

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::ConvertCluster
          (FBXConverter *this,vector<aiBone_*,_std::allocator<aiBone_*>_> *param_1,Cluster *cl,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *index_out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *count_out_indices,
          aiMatrix4x4 *absolute_transform,aiNode *parent,aiNode *root_node)

{
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
  *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  pointer puVar19;
  pointer puVar20;
  iterator __position;
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,aiBone*>,std::_Select1st<std::pair<std::__cxx11::string_const,aiBone*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,aiBone*>>>
  *this_01;
  undefined8 uVar21;
  const_iterator cVar22;
  Logger *pLVar23;
  ostream *poVar24;
  mapped_type *ppaVar25;
  aiBone *paVar26;
  ulong uVar27;
  aiVertexWeight *__s;
  long lVar28;
  unsigned_long uVar29;
  long lVar30;
  FBXConverter *this_02;
  unsigned_long uVar31;
  ulong uVar32;
  size_t __n;
  string deformer_name;
  aiString bone_name;
  aiBone *local_668;
  float local_65c;
  float local_658;
  float local_654;
  float local_650;
  float local_64c;
  float local_648;
  float local_644;
  float local_640;
  float local_63c;
  long *local_638;
  long local_628 [2];
  string local_618;
  float local_5f8;
  float local_5f4;
  float local_5f0;
  float local_5ec;
  float local_5e8;
  float local_5e4;
  float local_5e0;
  float local_5dc;
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,aiBone*>,std::_Select1st<std::pair<std::__cxx11::string_const,aiBone*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,aiBone*>>>
  *local_5d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_5d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_5c8;
  vector<aiBone*,std::allocator<aiBone*>> *local_5c0;
  char *local_5b8;
  undefined1 local_5b0 [32];
  aiBone *local_590;
  ios_base local_540 [268];
  uint local_434;
  char local_430 [1024];
  
  local_5c0 = (vector<aiBone*,std::allocator<aiBone*>> *)param_1;
  if (cl == (Cluster *)0x0) {
    __assert_fail("cl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x63b,
                  "void Assimp::FBX::FBXConverter::ConvertCluster(std::vector<aiBone *> &, const Cluster *, std::vector<size_t> &, std::vector<size_t> &, std::vector<size_t> &, const aiMatrix4x4 &, aiNode *, aiNode *)"
                 );
  }
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  this_02 = (FBXConverter *)(cl->node->super_Object).name._M_dataplus._M_p;
  local_5d0 = index_out_indices;
  local_5c8 = count_out_indices;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_618,this_02,
             (pointer)((long)&this_02->defaultMaterialIndex +
                      (cl->node->super_Object).name._M_string_length));
  FixNodeName((string *)local_5b0,this_02,&local_618);
  uVar21 = local_5b0._0_8_;
  __n = 0x3ff;
  if ((local_5b0._8_8_ & 0xfffffc00) == 0) {
    __n = local_5b0._8_8_ & 0xffffffff;
  }
  local_434 = (uint)__n;
  memcpy(local_430,(void *)local_5b0._0_8_,__n);
  local_430[__n] = '\0';
  if ((undefined1 *)uVar21 != local_5b0 + 0x10) {
    operator_delete((void *)uVar21,local_5b0._16_8_ + 1);
  }
  local_668 = (aiBone *)0x0;
  this_00 = &this->bone_map;
  cVar22 = std::
           _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
           ::find(&this_00->_M_t,&local_618);
  if ((_Rb_tree_header *)cVar22._M_node == &(this->bone_map)._M_t._M_impl.super__Rb_tree_header) {
    pLVar23 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[18]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
               (char (*) [18])"created new bone ");
    local_5b8 = local_430;
    poVar24 = (ostream *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_5b0,&local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar24,". Deformer: ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar24,local_618._M_dataplus._M_p,local_618._M_string_length);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar23,(char *)local_638);
    if (local_638 != local_628) {
      operator_delete(local_638,local_628[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
    std::ios_base::~ios_base(local_540);
    paVar26 = (aiBone *)operator_new(0x460);
    (paVar26->mName).length = 0;
    (paVar26->mName).data[0] = '\0';
    memset((paVar26->mName).data + 1,0x1b,0x3ff);
    paVar26->mNumWeights = 0;
    paVar26->mWeights = (aiVertexWeight *)0x0;
    (paVar26->mOffsetMatrix).a1 = 1.0;
    (paVar26->mOffsetMatrix).a2 = 0.0;
    (paVar26->mOffsetMatrix).a3 = 0.0;
    (paVar26->mOffsetMatrix).a4 = 0.0;
    (paVar26->mOffsetMatrix).b1 = 0.0;
    (paVar26->mOffsetMatrix).b2 = 1.0;
    (paVar26->mOffsetMatrix).b3 = 0.0;
    (paVar26->mOffsetMatrix).b4 = 0.0;
    (paVar26->mOffsetMatrix).c1 = 0.0;
    (paVar26->mOffsetMatrix).c2 = 0.0;
    (paVar26->mOffsetMatrix).c3 = 1.0;
    (paVar26->mOffsetMatrix).c4 = 0.0;
    (paVar26->mOffsetMatrix).d1 = 0.0;
    (paVar26->mOffsetMatrix).d2 = 0.0;
    (paVar26->mOffsetMatrix).d3 = 0.0;
    (paVar26->mOffsetMatrix).d4 = 1.0;
    uVar32 = (ulong)local_434;
    (paVar26->mName).length = local_434;
    local_668 = paVar26;
    local_5d8 = (_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,aiBone*>,std::_Select1st<std::pair<std::__cxx11::string_const,aiBone*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,aiBone*>>>
                 *)this_00;
    memcpy((paVar26->mName).data,local_430,uVar32);
    (paVar26->mName).data[uVar32] = '\0';
    fVar1 = (cl->transformLink).a2;
    fVar2 = (cl->transformLink).a3;
    fVar3 = (cl->transformLink).a4;
    fVar4 = (cl->transformLink).b1;
    fVar5 = (cl->transformLink).b2;
    fVar6 = (cl->transformLink).b3;
    fVar7 = (cl->transformLink).b4;
    fVar8 = (cl->transformLink).c1;
    fVar9 = (cl->transformLink).c2;
    fVar10 = (cl->transformLink).c3;
    fVar11 = (cl->transformLink).c4;
    fVar12 = (cl->transformLink).d1;
    fVar13 = (cl->transformLink).d2;
    fVar14 = (cl->transformLink).d3;
    fVar15 = (cl->transformLink).d4;
    (paVar26->mOffsetMatrix).a1 = (cl->transformLink).a1;
    (paVar26->mOffsetMatrix).a2 = fVar1;
    (paVar26->mOffsetMatrix).a3 = fVar2;
    (paVar26->mOffsetMatrix).a4 = fVar3;
    (paVar26->mOffsetMatrix).b1 = fVar4;
    (paVar26->mOffsetMatrix).b2 = fVar5;
    (paVar26->mOffsetMatrix).b3 = fVar6;
    (paVar26->mOffsetMatrix).b4 = fVar7;
    (paVar26->mOffsetMatrix).c1 = fVar8;
    (paVar26->mOffsetMatrix).c2 = fVar9;
    (paVar26->mOffsetMatrix).c3 = fVar10;
    (paVar26->mOffsetMatrix).c4 = fVar11;
    (paVar26->mOffsetMatrix).d1 = fVar12;
    (paVar26->mOffsetMatrix).d2 = fVar13;
    (paVar26->mOffsetMatrix).d3 = fVar14;
    (paVar26->mOffsetMatrix).d4 = fVar15;
    aiMatrix4x4t<float>::Inverse(&paVar26->mOffsetMatrix);
    paVar26 = local_668;
    fVar1 = absolute_transform->a1;
    local_640 = absolute_transform->a2;
    local_658 = absolute_transform->b1;
    local_650 = absolute_transform->b2;
    fVar2 = absolute_transform->b3;
    local_654 = absolute_transform->c1;
    local_64c = absolute_transform->c2;
    fVar3 = absolute_transform->d1;
    fVar4 = absolute_transform->d2;
    fVar5 = (local_668->mOffsetMatrix).a1;
    fVar6 = (local_668->mOffsetMatrix).a2;
    fVar7 = (local_668->mOffsetMatrix).a3;
    fVar8 = (local_668->mOffsetMatrix).a4;
    local_5dc = fVar3 * fVar8 + local_654 * fVar7 + fVar1 * fVar5 + local_658 * fVar6;
    local_5e0 = fVar4 * fVar8 + local_64c * fVar7 + local_640 * fVar5 + local_650 * fVar6;
    local_644 = absolute_transform->a3;
    local_648 = absolute_transform->c3;
    local_63c = absolute_transform->d3;
    local_5e4 = local_63c * fVar8 + local_648 * fVar7 + local_644 * fVar5 + fVar2 * fVar6;
    local_65c = absolute_transform->b4;
    fVar9 = absolute_transform->a4;
    fVar10 = absolute_transform->c4;
    local_5f8 = absolute_transform->d4;
    local_5e8 = fVar8 * local_5f8 + fVar7 * fVar10 + fVar5 * fVar9 + fVar6 * local_65c;
    fVar5 = (local_668->mOffsetMatrix).b2;
    fVar6 = (local_668->mOffsetMatrix).b1;
    fVar7 = (local_668->mOffsetMatrix).b3;
    fVar8 = (local_668->mOffsetMatrix).b4;
    local_5ec = fVar3 * fVar8 + local_654 * fVar7 + fVar1 * fVar6 + local_658 * fVar5;
    local_5f0 = fVar4 * fVar8 + local_64c * fVar7 + local_640 * fVar6 + local_650 * fVar5;
    local_5f4 = local_63c * fVar8 + local_648 * fVar7 + local_644 * fVar6 + fVar2 * fVar5;
    fVar11 = (local_668->mOffsetMatrix).c2;
    fVar12 = (local_668->mOffsetMatrix).c1;
    fVar13 = (local_668->mOffsetMatrix).c3;
    fVar14 = (local_668->mOffsetMatrix).c4;
    fVar15 = (local_668->mOffsetMatrix).d2;
    fVar16 = (local_668->mOffsetMatrix).d1;
    fVar17 = (local_668->mOffsetMatrix).d3;
    fVar18 = (local_668->mOffsetMatrix).d4;
    (local_668->mOffsetMatrix).a1 = local_5dc;
    (local_668->mOffsetMatrix).a2 = local_5e0;
    (local_668->mOffsetMatrix).a3 = local_5e4;
    (local_668->mOffsetMatrix).a4 = local_5e8;
    (local_668->mOffsetMatrix).b1 = local_5ec;
    (local_668->mOffsetMatrix).b2 = local_5f0;
    (local_668->mOffsetMatrix).b3 = local_5f4;
    (local_668->mOffsetMatrix).b4 =
         fVar8 * local_5f8 + fVar7 * fVar10 + fVar6 * fVar9 + fVar5 * local_65c;
    (local_668->mOffsetMatrix).c1 =
         fVar3 * fVar14 + local_654 * fVar13 + fVar1 * fVar12 + local_658 * fVar11;
    (local_668->mOffsetMatrix).c2 =
         fVar4 * fVar14 + local_64c * fVar13 + local_640 * fVar12 + local_650 * fVar11;
    (local_668->mOffsetMatrix).c3 =
         local_63c * fVar14 + local_648 * fVar13 + local_644 * fVar12 + fVar2 * fVar11;
    (local_668->mOffsetMatrix).c4 =
         fVar14 * local_5f8 + fVar13 * fVar10 + fVar12 * fVar9 + fVar11 * local_65c;
    (local_668->mOffsetMatrix).d1 =
         fVar3 * fVar18 + local_654 * fVar17 + fVar1 * fVar16 + local_658 * fVar15;
    (local_668->mOffsetMatrix).d2 =
         fVar4 * fVar18 + local_64c * fVar17 + local_640 * fVar16 + local_650 * fVar15;
    (local_668->mOffsetMatrix).d3 =
         local_63c * fVar18 + local_648 * fVar17 + local_644 * fVar16 + fVar2 * fVar15;
    (local_668->mOffsetMatrix).d4 =
         local_5f8 * fVar18 + fVar10 * fVar17 + fVar9 * fVar16 + local_65c * fVar15;
    local_668->mNumWeights =
         (uint)((ulong)((long)(out_indices->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(out_indices->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
    puVar19 = (out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
              _M_impl.super__Vector_impl_data._M_start;
    puVar20 = (out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    uVar27 = (long)puVar20 - (long)puVar19;
    uVar32 = 0xffffffffffffffff;
    if (-1 < (long)uVar27) {
      uVar32 = uVar27;
    }
    __s = (aiVertexWeight *)operator_new__(uVar32);
    lVar30 = (long)puVar20 - (long)puVar19;
    if (lVar30 != 0) {
      memset(__s,0,(lVar30 - 8U & 0xfffffffffffffff8) + 8);
    }
    this_01 = local_5d8;
    paVar26->mWeights = __s;
    lVar30 = (long)(local_5d0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(local_5d0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar30 != 0) {
      lVar30 = lVar30 >> 3;
      lVar28 = 0;
      do {
        uVar29 = (local_5d0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar28];
        if (uVar29 != 0xffffffffffffffff) {
          for (uVar31 = (local_5c8->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar28]; uVar31 != 0; uVar31 = uVar31 - 1)
          {
            __s->mVertexId =
                 (uint)(out_indices->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar29];
            __s->mWeight = (cl->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar28];
            __s = __s + 1;
            uVar29 = uVar29 + 1;
          }
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != lVar30 + (ulong)(lVar30 == 0));
    }
    local_5b0._0_8_ = local_5b0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_5b0,local_618._M_dataplus._M_p,
               local_618._M_dataplus._M_p + local_618._M_string_length);
    local_590 = local_668;
    std::
    _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,aiBone*>,std::_Select1st<std::pair<std::__cxx11::string_const,aiBone*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,aiBone*>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,aiBone*>>
              (this_01,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>
                        *)local_5b0);
    if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
      operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
    }
  }
  else {
    pLVar23 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[28]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
               (char (*) [28])"retrieved bone from lookup ");
    local_5b8 = local_430;
    poVar24 = (ostream *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_5b0,&local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar24,". Deformer:",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar24,local_618._M_dataplus._M_p,local_618._M_string_length);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar23,(char *)local_638);
    if (local_638 != local_628) {
      operator_delete(local_638,local_628[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
    std::ios_base::~ios_base(local_540);
    ppaVar25 = std::
               map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
               ::operator[](this_00,&local_618);
    local_668 = *ppaVar25;
  }
  pLVar23 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[31]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
             (char (*) [31])"bone research: Indicies size: ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_5b0);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar23,(char *)local_638);
  if (local_638 != local_628) {
    operator_delete(local_638,local_628[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  __position._M_current = *(aiBone ***)(local_5c0 + 8);
  if (__position._M_current == *(aiBone ***)(local_5c0 + 0x10)) {
    std::vector<aiBone*,std::allocator<aiBone*>>::_M_realloc_insert<aiBone*const&>
              (local_5c0,__position,&local_668);
  }
  else {
    *__position._M_current = local_668;
    *(long *)(local_5c0 + 8) = *(long *)(local_5c0 + 8) + 8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FBXConverter::ConvertCluster(std::vector<aiBone *> &local_mesh_bones, const Cluster *cl,
                                          std::vector<size_t> &out_indices, std::vector<size_t> &index_out_indices,
                                          std::vector<size_t> &count_out_indices, const aiMatrix4x4 &absolute_transform,
                                          aiNode *parent, aiNode *root_node) {
            ai_assert(cl); // make sure cluster valid
            std::string deformer_name = cl->TargetNode()->Name();
            aiString bone_name = aiString(FixNodeName(deformer_name));

            aiBone *bone = nullptr;

            if (bone_map.count(deformer_name)) {
				ASSIMP_LOG_DEBUG_F("retrieved bone from lookup ", bone_name.C_Str(), ". Deformer:", deformer_name);
				bone = bone_map[deformer_name];
			} else {
				ASSIMP_LOG_DEBUG_F("created new bone ", bone_name.C_Str(), ". Deformer: ", deformer_name);
				bone = new aiBone();
                bone->mName = bone_name;

                // store local transform link for post processing
                bone->mOffsetMatrix = cl->TransformLink();
                bone->mOffsetMatrix.Inverse();

                aiMatrix4x4 matrix = (aiMatrix4x4)absolute_transform;

                bone->mOffsetMatrix = bone->mOffsetMatrix * matrix; // * mesh_offset


                //
                // Now calculate the aiVertexWeights
                //

                aiVertexWeight *cursor = nullptr;

                bone->mNumWeights = static_cast<unsigned int>(out_indices.size());
                cursor = bone->mWeights = new aiVertexWeight[out_indices.size()];

                const size_t no_index_sentinel = std::numeric_limits<size_t>::max();
                const WeightArray& weights = cl->GetWeights();

                const size_t c = index_out_indices.size();
                for (size_t i = 0; i < c; ++i) {
                    const size_t index_index = index_out_indices[i];

                    if (index_index == no_index_sentinel) {
                        continue;
                    }

                    const size_t cc = count_out_indices[i];
                    for (size_t j = 0; j < cc; ++j) {
                        // cursor runs from first element relative to the start
                        // or relative to the start of the next indexes.
                        aiVertexWeight& out_weight = *cursor++;

                        out_weight.mVertexId = static_cast<unsigned int>(out_indices[index_index + j]);
                        out_weight.mWeight = weights[i];
                    }
                }

                bone_map.insert(std::pair<const std::string, aiBone *>(deformer_name, bone));
            }

            ASSIMP_LOG_DEBUG_F("bone research: Indicies size: ", out_indices.size());

            // lookup must be populated in case something goes wrong
            // this also allocates bones to mesh instance outside
            local_mesh_bones.push_back(bone);
        }